

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void parse_chunk(LexState *ls)

{
  uint8_t *puVar1;
  BCPos *l1;
  ushort uVar2;
  BCLine line;
  BCLine BVar3;
  FuncState *pFVar4;
  uint64_t uVar5;
  GCtab *pGVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  LexToken LVar10;
  BCPos BVar11;
  BCPos BVar12;
  BCPos list;
  BCPos BVar13;
  BCReg BVar14;
  BCReg BVar15;
  VarInfo *pVVar16;
  GCstr *pGVar17;
  VarIndex *pVVar18;
  cTValue *pcVar19;
  BCInsLine *pBVar20;
  uint uVar21;
  BCIns ins;
  short sVar22;
  int iVar23;
  char *__s2;
  FuncState *pFVar24;
  uint uVar25;
  undefined4 uVar26;
  ExpDesc e;
  anon_union_8_3_2ce71dea_for_u local_98;
  MSize local_90;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined8 local_80;
  ulong local_78;
  anon_union_8_3_2ce71dea_for_u local_70;
  MSize local_68;
  undefined1 local_64;
  byte local_63;
  BCLine local_54;
  FuncScope local_50;
  ulong local_40;
  FuncState *local_38;
  
  uVar9 = ls->level + 1;
  ls->level = uVar9;
  if (199 < uVar9) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  do {
    iVar23 = ls->tok;
    if ((iVar23 - 0x104U < 0x1e) && ((0x20020007U >> (iVar23 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x14 < iVar23 - 0x102U) {
      if (iVar23 != 0x11d) goto switchD_00115912_caseD_104;
      parse_label(ls);
      goto LAB_00116226;
    }
    line = ls->linenumber;
    switch(iVar23) {
    case 0x102:
      lj_lex_next(ls);
      parse_break(ls);
      goto LAB_00115ecb;
    case 0x103:
      lj_lex_next(ls);
      parse_block(ls);
      lex_match(ls,0x106,0x103,line);
      break;
    default:
switchD_00115912_caseD_104:
      pFVar24 = ls->fs;
      expr_primary(ls,(ExpDesc *)&local_98.s);
      if (local_90 == 0xd) {
        *(undefined1 *)((long)&pFVar24->bcbase[(ulong)local_98.sval & 0xffffffff].ins + 3) = 1;
      }
      else {
        local_80 = 0;
        parse_assignment(ls,(LHSVarList *)&local_98.s,1);
      }
      break;
    case 0x108:
      local_38 = ls->fs;
      local_50.nactvar = (uint8_t)local_38->nactvar;
      local_50.flags = '\x01';
      local_50.vstart = local_38->ls->vtop;
      local_50.prev = local_38->bl;
      local_38->bl = &local_50;
      lj_lex_next(ls);
      pGVar17 = lex_str(ls);
      iVar23 = ls->tok;
      if ((iVar23 == 0x2c) || (iVar23 == 0x10c)) {
        pFVar24 = ls->fs;
        local_40 = (ulong)pFVar24->pc;
        local_78 = (ulong)pFVar24->freereg;
        var_new(ls,0,(GCstr *)0x4);
        var_new(ls,1,(GCstr *)0x5);
        var_new(ls,2,(GCstr *)0x6);
        var_new(ls,3,pGVar17);
        uVar9 = 4;
        if (ls->tok == 0x2c) {
          BVar15 = 4;
          do {
            lj_lex_next(ls);
            uVar9 = BVar15 + 1;
            pGVar17 = lex_str(ls);
            var_new(ls,BVar15,pGVar17);
            BVar15 = uVar9;
          } while (ls->tok == 0x2c);
        }
        lex_check(ls,0x10c);
        BVar3 = ls->linenumber;
        BVar15 = expr_list(ls,(ExpDesc *)&local_98.s);
        assign_adjust(ls,3,BVar15,(ExpDesc *)&local_98.s);
        uVar21 = pFVar24->freereg + 4;
        if (pFVar24->framesize < uVar21) {
          if (0xf9 < uVar21) {
            err_syntax(pFVar24->ls,LJ_ERR_XSLOTS);
          }
          pFVar24->framesize = (uint8_t)uVar21;
        }
        local_54 = BVar3;
        if (uVar9 < 6) {
          uVar21 = pFVar24->bcbase[local_40].ins;
          if ((char)uVar21 == '6') {
            pGVar6 = pFVar24->kt;
            pGVar17 = lj_str_new(ls->L,"pairs",5);
            pcVar19 = lj_tab_getstr(pGVar6,pGVar17);
            if (((pcVar19 == (cTValue *)0x0) || ((pcVar19->field_4).it != 0)) ||
               (uVar26 = (undefined4)CONCAT71((int7)((ulong)pGVar6 >> 8),1),
               (pcVar19->field_4).i != uVar21 >> 0x10)) {
              pGVar6 = pFVar24->kt;
              pGVar17 = lj_str_new(ls->L,"next",4);
              pcVar19 = lj_tab_getstr(pGVar6,pGVar17);
              if (((pcVar19 == (cTValue *)0x0) || ((pcVar19->field_4).it != 0)) ||
                 (uVar26 = (undefined4)CONCAT71((int7)((ulong)pGVar6 >> 8),1),
                 (pcVar19->field_4).i != uVar21 >> 0x10)) goto LAB_0011643c;
            }
          }
          else {
            if ((uVar21 & 0xff) == 0x2d) {
              pVVar18 = pFVar24->uvmap + (uVar21 >> 0x10);
            }
            else {
              if ((uVar21 & 0xff) != 0x12) goto LAB_0011643c;
              pVVar18 = pFVar24->varmap + (uVar21 >> 0x10);
            }
            uVar5 = ls->vstack[*pVVar18].name.gcptr64;
            iVar23 = *(int *)(uVar5 + 0x14);
            if (iVar23 == 4) {
              __s2 = "next";
            }
            else {
              if (iVar23 != 5) goto LAB_0011643c;
              __s2 = "pairs";
            }
            iVar23 = strcmp((char *)(uVar5 + 0x18),__s2);
            uVar26 = (undefined4)CONCAT71((int7)((ulong)&local_98 >> 8),iVar23 == 0);
          }
        }
        else {
LAB_0011643c:
          uVar26 = 0;
        }
        pFVar4 = ls->fs;
        pVVar16 = ls->vstack;
        BVar13 = pFVar4->pc;
        uVar21 = pFVar4->nactvar;
        iVar23 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar21];
          pVVar16[uVar2].startpc = BVar13;
          pVVar16[uVar2].slot = (uint8_t)uVar21;
          uVar21 = uVar21 + 1;
          pVVar16[uVar2].info = '\0';
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        pFVar4->nactvar = uVar21;
        lex_check(ls,0x103);
        iVar23 = (int)local_78 * 0x100;
        local_78 = CONCAT44(local_78._4_4_,uVar26);
        BVar13 = bcemit_INS(pFVar24,(uint)(byte)((byte)uVar26 ^ 1) * 0x10 + iVar23 + 0x300 |
                                    0x7fff0048);
        local_64 = (undefined1)pFVar24->nactvar;
        local_63 = 0;
        local_68 = pFVar24->ls->vtop;
        local_70 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
        pFVar24->bl = (FuncScope *)&local_70;
        pFVar4 = ls->fs;
        uVar21 = pFVar4->nactvar;
        BVar15 = uVar9 - 3;
        if (BVar15 != 0) {
          pVVar16 = ls->vstack;
          BVar11 = pFVar4->pc;
          uVar25 = uVar21;
          BVar14 = BVar15;
          do {
            uVar21 = uVar25 + 1;
            uVar2 = pFVar4->varmap[uVar25];
            pVVar16[uVar2].startpc = BVar11;
            pVVar16[uVar2].slot = (uint8_t)uVar25;
            pVVar16[uVar2].info = '\0';
            BVar14 = BVar14 - 1;
            uVar25 = uVar21;
          } while (BVar14 != 0);
        }
        pFVar4->nactvar = uVar21;
        bcreg_reserve(pFVar24,BVar15);
        parse_block(ls);
        fscope_end(pFVar24);
        uVar21 = (pFVar24->pc - BVar13) + 0x7fff;
        if (0xffff < uVar21) {
LAB_001166c6:
          err_syntax(pFVar24->ls,LJ_ERR_XJUMP);
        }
        uVar25 = iVar23 + 0x300;
        *(short *)((long)&pFVar24->bcbase[BVar13].ins + 2) = (short)uVar21;
        bcemit_INS(pFVar24,(uint)(byte)local_78 + uVar9 * 0x1000000 + 0xfe000045 | uVar25 | 0x30000)
        ;
        BVar11 = bcemit_INS(pFVar24,uVar25 | 0x7fff0052);
        pBVar20 = pFVar24->bcbase;
        pBVar20[BVar11 - 1].line = local_54;
        pBVar20[BVar11].line = local_54;
        sVar22 = (short)(BVar13 - BVar11);
        if ((int)sVar22 != BVar13 - BVar11) goto LAB_001166c6;
        *(short *)((long)&pBVar20[BVar11].ins + 2) = sVar22 + -0x8000;
      }
      else {
        if (iVar23 != 0x3d) {
          err_syntax(ls,LJ_ERR_XFOR);
        }
        pFVar24 = ls->fs;
        BVar15 = pFVar24->freereg;
        var_new(ls,0,(GCstr *)0x1);
        var_new(ls,1,(GCstr *)0x2);
        var_new(ls,2,(GCstr *)0x3);
        var_new(ls,3,pGVar17);
        lex_check(ls,0x3d);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        lex_check(ls,0x2c);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        if (ls->tok == 0x2c) {
          lj_lex_next(ls);
          expr_binop(ls,(ExpDesc *)&local_98.s,0);
          expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        }
        else {
          bcemit_INS(pFVar24,pFVar24->freereg << 8 | 0x10029);
          bcreg_reserve(pFVar24,1);
        }
        pFVar4 = ls->fs;
        pVVar16 = ls->vstack;
        BVar13 = pFVar4->pc;
        uVar9 = pFVar4->nactvar;
        iVar23 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar9];
          pVVar16[uVar2].startpc = BVar13;
          pVVar16[uVar2].slot = (uint8_t)uVar9;
          uVar9 = uVar9 + 1;
          pVVar16[uVar2].info = '\0';
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        pFVar4->nactvar = uVar9;
        lex_check(ls,0x103);
        uVar21 = BVar15 << 8;
        BVar13 = bcemit_INS(pFVar24,uVar21 | 0x7fff004d);
        local_8c = (undefined1)pFVar24->nactvar;
        local_8b = 0;
        local_90 = pFVar24->ls->vtop;
        local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
        pFVar24->bl = (FuncScope *)&local_98;
        pFVar4 = ls->fs;
        pVVar16 = ls->vstack;
        uVar9 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar9];
        pVVar16[uVar2].startpc = pFVar4->pc;
        pVVar16[uVar2].slot = (uint8_t)uVar9;
        pVVar16[uVar2].info = '\0';
        pFVar4->nactvar = uVar9 + 1;
        bcreg_reserve(pFVar24,1);
        parse_block(ls);
        fscope_end(pFVar24);
        BVar11 = bcemit_INS(pFVar24,uVar21 | 0x7fff004f);
        pBVar20 = pFVar24->bcbase;
        pBVar20[BVar11].line = line;
        sVar22 = (short)(BVar13 - BVar11);
        if ((int)sVar22 != BVar13 - BVar11) goto LAB_001166c6;
        *(short *)((long)&pBVar20[BVar11].ins + 2) = sVar22 + -0x8000;
        uVar9 = (pFVar24->pc - BVar13) + 0x7fff;
        if (0xffff < uVar9) goto LAB_001166c6;
        *(short *)((long)&pBVar20[BVar13].ins + 2) = (short)uVar9;
      }
      lex_match(ls,0x106,0x108,line);
      pFVar24 = local_38;
      goto LAB_001165fc;
    case 0x109:
      lj_lex_next(ls);
      pFVar24 = ls->fs;
      pGVar17 = lex_str(ls);
      var_lookup_(pFVar24,pGVar17,(ExpDesc *)&local_98.s,1);
      while (iVar23 = ls->tok, iVar23 == 0x2e) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      if (iVar23 == 0x3a) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      parse_body(ls,(ExpDesc *)&local_70.s,(uint)(iVar23 == 0x3a),line);
      pFVar24 = ls->fs;
      bcemit_store(pFVar24,(ExpDesc *)&local_98.s,(ExpDesc *)&local_70.s);
      pFVar24->bcbase[pFVar24->pc - 1].line = line;
      break;
    case 0x10a:
      LVar10 = lj_lex_lookahead(ls);
      if (LVar10 != 0x11f) goto switchD_00115912_caseD_104;
      lj_lex_next(ls);
      pFVar24 = ls->fs;
      pGVar17 = lex_str(ls);
      pVVar16 = gola_findlabel(ls,pGVar17);
      if (pVVar16 != (VarInfo *)0x0) {
        bcemit_INS(pFVar24,(uint)pVVar16->slot << 8 | 0x7fff0055);
      }
      puVar1 = &pFVar24->bl->flags;
      *puVar1 = *puVar1 | 4;
      BVar13 = bcemit_jmp(pFVar24);
      gola_new(ls,pGVar17,'\x02',BVar13);
      break;
    case 0x10b:
      pFVar24 = ls->fs;
      local_98.s.info = 0xffffffff;
      BVar13 = parse_then(ls);
      l1 = &pFVar24->jpc;
      while (ls->tok == 0x105) {
        BVar11 = bcemit_jmp(pFVar24);
        jmp_append(pFVar24,(BCPos *)&local_98,BVar11);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,l1,BVar13);
        BVar13 = parse_then(ls);
      }
      if (ls->tok == 0x104) {
        BVar11 = bcemit_jmp(pFVar24);
        jmp_append(pFVar24,(BCPos *)&local_98,BVar11);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,l1,BVar13);
        lj_lex_next(ls);
        parse_block(ls);
      }
      else {
        jmp_append(pFVar24,(BCPos *)&local_98,BVar13);
      }
      pFVar24->lasttarget = pFVar24->pc;
      jmp_append(pFVar24,l1,local_98.s.info);
      lex_match(ls,0x106,0x10b,line);
      goto LAB_00116604;
    case 0x10d:
      lj_lex_next(ls);
      if (ls->tok == 0x109) {
        lj_lex_next(ls);
        pFVar24 = ls->fs;
        pGVar17 = lex_str(ls);
        var_new(ls,0,pGVar17);
        BVar15 = pFVar24->freereg;
        bcreg_reserve(pFVar24,1);
        pFVar4 = ls->fs;
        pVVar16 = ls->vstack;
        uVar9 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar9];
        pVVar16[uVar2].startpc = pFVar4->pc;
        pVVar16[uVar2].slot = (uint8_t)uVar9;
        pVVar16[uVar2].info = '\0';
        pFVar4->nactvar = uVar9 + 1;
        parse_body(ls,(ExpDesc *)&local_98.s,0,ls->linenumber);
        if ((local_90 == 0xc) && (pFVar24->nactvar <= local_98.s.info)) {
          pFVar24->freereg = pFVar24->freereg - 1;
        }
        expr_toreg(pFVar24,(ExpDesc *)&local_98.s,BVar15);
        ls->vstack[pFVar24->varmap[pFVar24->nactvar - 1]].startpc = pFVar24->pc;
      }
      else {
        pGVar17 = lex_str(ls);
        var_new(ls,0,pGVar17);
        iVar23 = ls->tok;
        BVar15 = 1;
        if (iVar23 == 0x2c) {
          BVar14 = 1;
          do {
            lj_lex_next(ls);
            BVar15 = BVar14 + 1;
            pGVar17 = lex_str(ls);
            var_new(ls,BVar14,pGVar17);
            iVar23 = ls->tok;
            BVar14 = BVar15;
          } while (iVar23 == 0x2c);
        }
        if (iVar23 == 0x3d) {
          lj_lex_next(ls);
          BVar14 = expr_list(ls,(ExpDesc *)&local_98.s);
        }
        else {
          local_90 = 0xe;
          BVar14 = 0;
        }
        assign_adjust(ls,BVar15,BVar14,(ExpDesc *)&local_98.s);
        pFVar24 = ls->fs;
        uVar9 = pFVar24->nactvar;
        if (BVar15 != 0) {
          pVVar16 = ls->vstack;
          BVar13 = pFVar24->pc;
          uVar21 = uVar9;
          do {
            uVar9 = uVar21 + 1;
            uVar2 = pFVar24->varmap[uVar21];
            pVVar16[uVar2].startpc = BVar13;
            pVVar16[uVar2].slot = (uint8_t)uVar21;
            pVVar16[uVar2].info = '\0';
            BVar15 = BVar15 - 1;
            uVar21 = uVar9;
          } while (BVar15 != 0);
        }
        pFVar24->nactvar = uVar9;
      }
      break;
    case 0x111:
      pFVar24 = ls->fs;
      uVar9 = pFVar24->pc;
      pFVar24->lasttarget = uVar9;
      local_8c = (undefined1)pFVar24->nactvar;
      local_8b = 1;
      local_90 = pFVar24->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
      local_63 = 0;
      pFVar24->bl = (FuncScope *)&local_70;
      local_70.sval = (GCstr *)&local_98;
      local_68 = local_90;
      local_64 = local_8c;
      lj_lex_next(ls);
      bcemit_INS(pFVar24,pFVar24->nactvar << 8 | 0x55);
      parse_chunk(ls);
      lex_match(ls,0x115,0x111,line);
      BVar13 = expr_cond(ls);
      if ((local_63 & 8) == 0) {
        fscope_end(pFVar24);
      }
      else {
        parse_break(ls);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,&pFVar24->jpc,BVar13);
        fscope_end(pFVar24);
        BVar13 = bcemit_jmp(pFVar24);
      }
      jmp_patch(pFVar24,BVar13,uVar9);
      uVar21 = (pFVar24->pc - uVar9) + 0x7fff;
      if (0xffff < uVar21) goto LAB_001166c6;
      *(short *)((long)&pFVar24->bcbase[uVar9].ins + 2) = (short)uVar21;
LAB_001165fc:
      fscope_end(pFVar24);
      goto LAB_00116604;
    case 0x112:
      pFVar24 = ls->fs;
      lj_lex_next(ls);
      bVar8 = pFVar24->flags | 0x20;
      pFVar24->flags = bVar8;
      ins = 0x1004b;
      uVar9 = ls->tok - 0x104;
      if (((0x1d < uVar9) || ((0x20020007U >> (uVar9 & 0x1f) & 1) == 0)) && (ls->tok != 0x3b)) {
        BVar15 = expr_list(ls,(ExpDesc *)&local_98.s);
        if (BVar15 == 1) {
          if (local_90 == 0xd) {
            pBVar20 = pFVar24->bcbase;
            if ((char)pBVar20[(ulong)local_98.sval & 0xffffffff].ins == 'G') goto LAB_0011663c;
            pFVar24->pc = pFVar24->pc - 1;
            uVar9 = (pBVar20[(ulong)local_98.sval & 0xffffffff].ins & 0xff) + 2;
            uVar21 = pBVar20[(ulong)local_98.sval & 0xffffffff].ins & 0xffff00;
LAB_001166a6:
            ins = uVar21 | uVar9;
          }
          else {
            BVar15 = expr_toanyreg(pFVar24,(ExpDesc *)&local_98.s);
            ins = BVar15 << 8 | 0x2004c;
          }
        }
        else {
          if (local_90 != 0xd) {
            expr_tonextreg(pFVar24,(ExpDesc *)&local_98.s);
            uVar9 = pFVar24->nactvar << 8;
            uVar21 = BVar15 * 0x10000 + 0x1004a;
            goto LAB_001166a6;
          }
          pBVar20 = pFVar24->bcbase;
LAB_0011663c:
          *(undefined1 *)((long)&pBVar20[(ulong)local_98.sval & 0xffffffff].ins + 3) = 0;
          ins = (local_98.s.aux - pFVar24->nactvar) * 0x10000 | pFVar24->nactvar << 8 | 0x49;
        }
        bVar8 = pFVar24->flags;
      }
      if ((bVar8 & 1) != 0) {
        bcemit_INS(pFVar24,0x80000032);
      }
      bcemit_INS(pFVar24,ins);
LAB_00115ecb:
      bVar7 = false;
      goto LAB_0011660b;
    case 0x116:
      pFVar24 = ls->fs;
      lj_lex_next(ls);
      BVar13 = pFVar24->pc;
      pFVar24->lasttarget = BVar13;
      BVar11 = expr_cond(ls);
      local_8c = (undefined1)pFVar24->nactvar;
      local_8b = 1;
      local_90 = pFVar24->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
      pFVar24->bl = (FuncScope *)&local_98;
      lex_check(ls,0x103);
      BVar12 = bcemit_INS(pFVar24,pFVar24->nactvar << 8 | 0x55);
      parse_block(ls);
      list = bcemit_jmp(pFVar24);
      jmp_patch(pFVar24,list,BVar13);
      lex_match(ls,0x106,0x116,line);
      fscope_end(pFVar24);
      pFVar24->lasttarget = pFVar24->pc;
      jmp_append(pFVar24,&pFVar24->jpc,BVar11);
      uVar9 = (pFVar24->pc - BVar12) + 0x7fff;
      if (0xffff < uVar9) goto LAB_001166c6;
      *(short *)((long)&pFVar24->bcbase[BVar12].ins + 2) = (short)uVar9;
LAB_00116604:
      bVar7 = true;
      goto LAB_0011660b;
    }
LAB_00116226:
    bVar7 = true;
LAB_0011660b:
    if (ls->tok == 0x3b) {
      lj_lex_next(ls);
    }
    ls->fs->freereg = ls->fs->nactvar;
  } while (bVar7);
  ls->level = ls->level - 1;
  return;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}